

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O2

bool __thiscall SightCheck::P_SightCheckLine(SightCheck *this,line_t_conflict *ld)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  intercept_t newintercept;
  undefined1 local_58 [16];
  anon_union_8_2_50eab53d_for_d local_48;
  DVector2 local_38;
  
  bVar9 = true;
  if (ld->validcount != validcount) {
    ld->validcount = validcount;
    local_58._0_8_ = (ld->v1->p).X;
    local_58._8_8_ = (ld->v1->p).Y;
    iVar7 = P_PointOnDivlineSide((DVector2 *)local_58,&this->Trace);
    local_38.X = (ld->v2->p).X;
    local_38.Y = (ld->v2->p).Y;
    iVar8 = P_PointOnDivlineSide(&local_38,&this->Trace);
    if ((iVar7 != iVar8) &&
       (dVar1 = (this->Trace).x, dVar2 = (this->Trace).y, dVar5 = (ld->delta).X,
       dVar6 = (ld->delta).Y, dVar3 = (ld->v1->p).X, dVar4 = (ld->v1->p).Y,
       (dVar3 - ((this->Trace).dx + dVar1)) * dVar6 + (((this->Trace).dy + dVar2) - dVar4) * dVar5
       <= 1.52587890625e-05 == 1.52587890625e-05 < (dVar3 - dVar1) * dVar6 + (dVar2 - dVar4) * dVar5
       )) {
      if (((ld->backsector == (sector_t_conflict *)0x0) || ((ld->flags & 0x4000004) != 4)) ||
         (((short)ld->flags < 0 &&
          (((this->Flags & 4U) == 0 ||
           (((this->Flags & 2U) == 0 &&
            ((((ld->activation & 8) == 0 || ((ld->special != 0xe2 && (ld->special != 0x50)))) ||
             ((ld->args[1] != 0 && (ld->args[1] != level.levelnum)))))))))))) {
        bVar9 = false;
      }
      else {
        sightcounts[3] = sightcounts[3] + 1;
        local_58[8] = 1;
        local_48.line = ld;
        TArray<intercept_t,_intercept_t>::Push(&intercepts,(intercept_t *)local_58);
      }
    }
  }
  return bVar9;
}

Assistant:

bool SightCheck::P_SightCheckLine (line_t *ld)
{
	divline_t dl;

	if (ld->validcount == validcount)
	{
		return true;
	}
	ld->validcount = validcount;
	if (P_PointOnDivlineSide (ld->v1->fPos(), &Trace) ==
		P_PointOnDivlineSide (ld->v2->fPos(), &Trace))
	{
		return true;		// line isn't crossed
	}
	P_MakeDivline (ld, &dl);
	if (P_PointOnDivlineSide (Trace.x, Trace.y, &dl) ==
		P_PointOnDivlineSide (Trace.x+Trace.dx, Trace.y+Trace.dy, &dl))
	{
		return true;		// line isn't crossed
	}

	// try to early out the check
	if (!ld->backsector || !(ld->flags & ML_TWOSIDED) || (ld->flags & ML_BLOCKSIGHT))
		return false;	// stop checking

	// [RH] don't see past block everything lines
	if (ld->flags & ML_BLOCKEVERYTHING)
	{
		if (!(Flags & SF_SEEPASTBLOCKEVERYTHING))
		{
			return false;
		}
		// Pretend the other side is invisible if this is not an impact line
		// that runs a script on the current map. Used to prevent monsters
		// from trying to attack through a block everything line unless
		// there's a chance their attack will make it nonblocking.
		if (!(Flags & SF_SEEPASTSHOOTABLELINES))
		{
			if (!(ld->activation & SPAC_Impact))
			{
				return false;
			}
			if (ld->special != ACS_Execute && ld->special != ACS_ExecuteAlways)
			{
				return false;
			}
			if (ld->args[1] != 0 && ld->args[1] != level.levelnum)
			{
				return false;
			}
		}
	}

	sightcounts[3]++;
	// store the line for later intersection testing
	intercept_t newintercept;
	newintercept.isaline = true;
	newintercept.d.line = ld;
	intercepts.Push (newintercept);

	return true;
}